

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O2

string * __thiscall
LinearRegression::generateTestDataEvaluation_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  string *__return_storage_ptr___00;
  size_t sVar1;
  Attribute *pAVar2;
  ulong attID;
  LinearRegression *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  string prediction;
  undefined1 local_598 [32];
  string evalFunction;
  string local_558;
  string local_538;
  string loadFunction;
  string testTuple;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string *local_378;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string attrConstruct;
  string attributeString;
  
  std::__cxx11::string::string((string *)&attributeString,"",(allocator *)&attrConstruct);
  offset_abi_cxx11_(&testTuple,this,4);
  local_378 = __return_storage_ptr__;
  std::operator+(&attrConstruct,&testTuple,"qi::phrase_parse(tuple.begin(),tuple.end(),");
  std::__cxx11::string::~string((string *)&testTuple);
  local_5e8 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= local_5e8) break;
    pAVar2 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_5e8);
    offset_abi_cxx11_(&local_558,this,5);
    pLVar3 = (LinearRegression *)local_598;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar3,"\n",
                   &local_558);
    std::operator+(&local_5d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar3,
                   "qi::");
    typeToStr_abi_cxx11_(&local_538,pLVar3,pAVar2->_type);
    std::operator+(&evalFunction,&local_5d8,&local_538);
    std::operator+(&prediction,&evalFunction,"_[phoenix::ref(");
    std::operator+(&loadFunction,&prediction,&pAVar2->_name);
    std::operator+(&testTuple,&loadFunction,") = qi::_1]>>");
    std::__cxx11::string::append((string *)&attrConstruct);
    std::__cxx11::string::~string((string *)&testTuple);
    std::__cxx11::string::~string((string *)&loadFunction);
    std::__cxx11::string::~string((string *)&prediction);
    std::__cxx11::string::~string((string *)&evalFunction);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)local_598);
    std::__cxx11::string::~string((string *)&local_558);
    pLVar3 = this;
    offset_abi_cxx11_(&local_5d8,this,2);
    typeToStr_abi_cxx11_((string *)local_598,pLVar3,pAVar2->_type);
    std::operator+(&evalFunction,&local_5d8,(string *)local_598);
    std::operator+(&prediction,&evalFunction," ");
    std::operator+(&loadFunction,&prediction,&pAVar2->_name);
    std::operator+(&testTuple,&loadFunction,";\n");
    std::__cxx11::string::append((string *)&attributeString);
    std::__cxx11::string::~string((string *)&testTuple);
    std::__cxx11::string::~string((string *)&loadFunction);
    std::__cxx11::string::~string((string *)&prediction);
    std::__cxx11::string::~string((string *)&evalFunction);
    std::__cxx11::string::~string((string *)local_598);
    std::__cxx11::string::~string((string *)&local_5d8);
    local_5e8 = local_5e8 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  offset_abi_cxx11_(&prediction,this,5);
  std::operator+(&loadFunction,",\n",&prediction);
  std::operator+(&testTuple,&loadFunction,"\'|\');\n");
  std::__cxx11::string::append((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&prediction);
  offset_abi_cxx11_(&local_438,this,1);
  std::operator+(&local_418,&local_438,"struct Test_tuple\n");
  offset_abi_cxx11_(&local_458,this,1);
  std::operator+(&local_3f8,&local_418,&local_458);
  std::operator+(&local_3d8,&local_3f8,"{\n");
  std::operator+(&local_3b8,&local_3d8,&attributeString);
  offset_abi_cxx11_(&local_478,this,2);
  std::operator+(&local_398,&local_3b8,&local_478);
  std::operator+(&local_538,&local_398,"Test_tuple(const std::string& tuple)\n");
  offset_abi_cxx11_(&local_498,this,2);
  std::operator+(&local_558,&local_538,&local_498);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 &local_558,"{\n");
  std::operator+(&local_5d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 &attrConstruct);
  offset_abi_cxx11_(&local_4b8,this,2);
  std::operator+(&evalFunction,&local_5d8,&local_4b8);
  std::operator+(&prediction,&evalFunction,"}\n");
  offset_abi_cxx11_(&local_4d8,this,1);
  std::operator+(&loadFunction,&prediction,&local_4d8);
  std::operator+(&testTuple,&loadFunction,"};\n\n");
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&prediction);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)local_598);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  offset_abi_cxx11_(&local_1d0,this,1);
  std::operator+(&local_1b0,&local_1d0,"void loadTestDataset(");
  std::operator+(&local_190,&local_1b0,"std::vector<Test_tuple>& TestDataset)\n");
  offset_abi_cxx11_(&local_1f0,this,1);
  std::operator+(&local_170,&local_190,&local_1f0);
  std::operator+(&local_150,&local_170,"{\n");
  offset_abi_cxx11_(&local_210,this,2);
  std::operator+(&local_130,&local_150,&local_210);
  std::operator+(&local_110,&local_130,"std::ifstream input;\n");
  offset_abi_cxx11_(&local_230,this,2);
  std::operator+(&local_f0,&local_110,&local_230);
  std::operator+(&local_d0,&local_f0,"std::string line;\n");
  offset_abi_cxx11_(&local_250,this,2);
  std::operator+(&local_b0,&local_d0,&local_250);
  std::operator+(&local_90,&local_b0,"input.open(PATH_TO_DATA + \"test_data.tbl\");\n");
  offset_abi_cxx11_(&local_270,this,2);
  std::operator+(&local_4d8,&local_90,&local_270);
  std::operator+(&local_4b8,&local_4d8,"if (!input)\n");
  offset_abi_cxx11_(&local_290,this,2);
  std::operator+(&local_498,&local_4b8,&local_290);
  std::operator+(&local_478,&local_498,"{\n");
  offset_abi_cxx11_(&local_2b0,this,3);
  std::operator+(&local_458,&local_478,&local_2b0);
  std::operator+(&local_438,&local_458,"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n");
  offset_abi_cxx11_(&local_2d0,this,3);
  std::operator+(&local_418,&local_438,&local_2d0);
  std::operator+(&local_3f8,&local_418,"exit(1);\n");
  offset_abi_cxx11_(&local_2f0,this,2);
  std::operator+(&local_3d8,&local_3f8,&local_2f0);
  std::operator+(&local_3b8,&local_3d8,"}\n");
  offset_abi_cxx11_(&local_310,this,2);
  std::operator+(&local_398,&local_3b8,&local_310);
  std::operator+(&local_538,&local_398,"while(getline(input, line))\n");
  offset_abi_cxx11_(&local_330,this,3);
  std::operator+(&local_558,&local_538,&local_330);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 &local_558,"TestDataset.push_back(Test_tuple(line));\n");
  offset_abi_cxx11_(&local_350,this,2);
  std::operator+(&local_5d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 &local_350);
  std::operator+(&evalFunction,&local_5d8,"input.close();\n");
  offset_abi_cxx11_(&local_370,this,1);
  std::operator+(&prediction,&evalFunction,&local_370);
  std::operator+(&loadFunction,&prediction,"}\n\n");
  std::__cxx11::string::~string((string *)&prediction);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)local_598);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&prediction,"",(allocator *)&evalFunction);
  for (attID = 0; attID != 100; attID = attID + 1) {
    if (((this->super_Application)._features.super__Base_bitset<2UL>._M_w[attID >> 6] >>
         (attID & 0x3f) & 1) != 0) {
      pAVar2 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          attID);
      if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[attID >> 6] &
          1L << ((byte)attID & 0x3f)) == 0) {
        std::__cxx11::to_string
                  (&local_538,
                   (this->_parameterIndex).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[attID]);
        std::operator+(&local_558,"params[",&local_538);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_598,&local_558,"]*tuple.");
        std::operator+(&local_5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_598,&pAVar2->_name);
        std::operator+(&evalFunction,&local_5d8,"+");
        std::__cxx11::string::append((string *)&prediction);
        std::__cxx11::string::~string((string *)&evalFunction);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)local_598);
        std::__cxx11::string::~string((string *)&local_558);
        this_00 = &local_538;
      }
      else {
        std::operator+(&local_558,"params[index_",&pAVar2->_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_598,&local_558,"[tuple.");
        std::operator+(&local_5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_598,&pAVar2->_name);
        std::operator+(&evalFunction,&local_5d8,"]]+");
        std::__cxx11::string::append((string *)&prediction);
        std::__cxx11::string::~string((string *)&evalFunction);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)local_598);
        this_00 = &local_558;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
  }
  std::__cxx11::string::pop_back();
  offset_abi_cxx11_(&local_1f0,this,1);
  std::operator+(&local_1d0,&local_1f0,"void evaluateModel()\n");
  __return_storage_ptr___00 = local_378;
  offset_abi_cxx11_(&local_210,this,1);
  std::operator+(&local_1b0,&local_1d0,&local_210);
  std::operator+(&local_190,&local_1b0,"{\n");
  offset_abi_cxx11_(&local_230,this,2);
  std::operator+(&local_170,&local_190,&local_230);
  std::operator+(&local_150,&local_170,"std::vector<Test_tuple> TestDataset;\n");
  offset_abi_cxx11_(&local_250,this,2);
  std::operator+(&local_130,&local_150,&local_250);
  std::operator+(&local_110,&local_130,"loadTestDataset(TestDataset);\n");
  offset_abi_cxx11_(&local_270,this,2);
  std::operator+(&local_f0,&local_110,&local_270);
  std::operator+(&local_d0,&local_f0,"double diff, error = 0.0;\n");
  offset_abi_cxx11_(&local_290,this,2);
  std::operator+(&local_b0,&local_d0,&local_290);
  std::operator+(&local_90,&local_b0,"for (Test_tuple& tuple : TestDataset)\n");
  offset_abi_cxx11_(&local_2b0,this,2);
  std::operator+(&local_4d8,&local_90,&local_2b0);
  std::operator+(&local_4b8,&local_4d8,"{\n");
  offset_abi_cxx11_(&local_2d0,this,3);
  std::operator+(&local_498,&local_4b8,&local_2d0);
  std::operator+(&local_478,&local_498,"diff = params[0]+");
  std::operator+(&local_458,&local_478,&prediction);
  std::operator+(&local_438,&local_458,";\n");
  offset_abi_cxx11_(&local_2f0,this,3);
  std::operator+(&local_418,&local_438,&local_2f0);
  std::operator+(&local_3f8,&local_418,"error += diff * diff;\n");
  offset_abi_cxx11_(&local_310,this,2);
  std::operator+(&local_3d8,&local_3f8,&local_310);
  std::operator+(&local_3b8,&local_3d8,"}\n");
  offset_abi_cxx11_(&local_330,this,2);
  std::operator+(&local_398,&local_3b8,&local_330);
  std::operator+(&local_538,&local_398,"error /= TestDataset.size();\n");
  offset_abi_cxx11_(&local_350,this,2);
  std::operator+(&local_558,&local_538,&local_350);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 &local_558,"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n");
  offset_abi_cxx11_(&local_370,this,1);
  std::operator+(&local_5d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 &local_370);
  std::operator+(&evalFunction,&local_5d8,"}\n");
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)local_598);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::operator+(&local_5d8,&testTuple,&loadFunction);
  std::operator+(__return_storage_ptr___00,&local_5d8,&evalFunction);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&prediction);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&attributeString);
  return __return_storage_ptr___00;
}

Assistant:

std::string LinearRegression::generateTestDataEvaluation()
{
    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the SQL generator as well.
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"test_data.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";
    
    std::string prediction = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        
        if (_categoricalFeatures[var])
            prediction += "params[index_"+att->_name+"[tuple."+att->_name+"]]+";
        else
            prediction += "params["+std::to_string(_parameterIndex[var])+
                "]*tuple."+att->_name+"+";
    }
    prediction.pop_back();
    
    std::string evalFunction = offset(1)+"void evaluateModel()\n"+offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"double diff, error = 0.0;\n"+
        offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"diff = params[0]+"+prediction+";\n"+
        offset(3)+"error += diff * diff;\n"+
        offset(2)+"}\n"+
        offset(2)+"error /= TestDataset.size();\n"+
        offset(2)+"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}